

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovContext.cpp
# Opt level: O3

void __thiscall
cov::Context::Context(Context *this,Device *device,contextCallback pfnNotify,void *userData)

{
  int iVar1;
  IcdDispatch *pIVar2;
  float priority;
  VkDeviceCreateInfo deviceCreateInfo;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  undefined8 uStack_30;
  undefined4 *local_28;
  
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_magic = CONTEXT_MAGIC;
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = true;
  pIVar2 = getIcdTable();
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_icdTable = pIVar2;
  this->m_device = device;
  this->m_callback = pfnNotify;
  this->m_userData = userData;
  this->m_vkDevice = (VkDevice)0x0;
  this->m_vkQueue = (VkQueue)0x0;
  puStack_80 = &local_48;
  uStack_40 = 0;
  local_48 = 2;
  local_38 = (ulong)device->m_vkQueueFamilyIndex << 0x20;
  uStack_30 = 1;
  local_28 = &local_9c;
  local_9c = 0x3f800000;
  uStack_90 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_58 = 0;
  local_98 = 3;
  local_88 = 0x100000000;
  if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess == true) {
    iVar1 = vkCreateDevice(device->m_vkPhysicalDevice,&local_98,0,&this->m_vkDevice);
    (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = iVar1 == 0;
    if (iVar1 == 0) {
      vkGetDeviceQueue(this->m_vkDevice,this->m_device->m_vkQueueFamilyIndex,0,&this->m_vkQueue);
      return;
    }
    pfnNotify = this->m_callback;
    userData = this->m_userData;
  }
  else {
    (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = false;
  }
  (*pfnNotify)("failed to create context!",(void *)0x0,0,userData);
  return;
}

Assistant:

Context::Context(const Device& device, contextCallback pfnNotify, void* userData)
    : ClObject(),
      m_device(device),
      m_callback(pfnNotify),
      m_userData(userData),
      m_vkDevice(VK_NULL_HANDLE),
      m_vkQueue(VK_NULL_HANDLE)
{
    VkDeviceQueueCreateInfo queueCreateInfo{};
    queueCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    queueCreateInfo.queueFamilyIndex = m_device.m_vkQueueFamilyIndex;
    queueCreateInfo.queueCount = 1;
    const float priority = 1.0f;
    queueCreateInfo.pQueuePriorities = &priority;

    VkDeviceCreateInfo deviceCreateInfo{};
    deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    deviceCreateInfo.queueCreateInfoCount = 1;
    deviceCreateInfo.pQueueCreateInfos = &queueCreateInfo;
    m_initSuccess = m_initSuccess &&
        vkCreateDevice(m_device.m_vkPhysicalDevice, &deviceCreateInfo, nullptr, &m_vkDevice) == VK_SUCCESS;

    if (m_initSuccess) {
        vkGetDeviceQueue(m_vkDevice, m_device.m_vkQueueFamilyIndex, 0, &m_vkQueue);
    } else {
        m_callback("failed to create context!", nullptr, 0, m_userData);
    }
}